

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::WriteLocalMakefile(cmLocalUnixMakefileGenerator3 *this)

{
  _Rb_tree_node_base *info;
  _Rb_tree_node_base *p_Var1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  Encoding encoding;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  _Base_ptr *__lhs;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  string base;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
  localObjectFiles;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emittedTargets;
  string ruleFileNameFull;
  string ruleFileName;
  cmGeneratedFileStream ruleFileStream;
  
  std::__cxx11::string::string((string *)&ruleFileName,"Makefile",(allocator *)&ruleFileStream);
  ConvertToFullPath(&ruleFileNameFull,this,&ruleFileName);
  encoding = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
               _vptr_cmGlobalGenerator[5])();
  cmGeneratedFileStream::cmGeneratedFileStream
            (&ruleFileStream,ruleFileNameFull._M_dataplus._M_p,false,encoding);
  if (((&ruleFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20
       )[(long)ruleFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
               _vptr_basic_ostream[-3]] & 5) == 0) {
    bVar3 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)this);
    if (!bVar3) {
      cmGeneratedFileStream::SetCopyIfDifferent(&ruleFileStream,true);
    }
    WriteLocalAllRules(this,(ostream *)&ruleFileStream);
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header;
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar3 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)this);
    if (bVar3) {
      cmGlobalUnixMakefileGenerator3::WriteConvenienceRules
                ((cmGlobalUnixMakefileGenerator3 *)
                 (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator,
                 (ostream *)&ruleFileStream,&emittedTargets);
    }
    else {
      WriteLocalMakefileTargets(this,(ostream *)&ruleFileStream,&emittedTargets);
    }
    bVar3 = this->SkipPreprocessedSourceRules;
    bVar2 = this->SkipAssemblySourceRules;
    localObjectFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &localObjectFiles._M_t._M_impl.super__Rb_tree_header._M_header;
    localObjectFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    localObjectFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    localObjectFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    localObjectFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         localObjectFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    GetLocalObjectFiles(this,&localObjectFiles);
    for (p_Var5 = localObjectFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &localObjectFiles._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      info = p_Var5 + 2;
      WriteObjectConvenienceRule
                (this,(ostream *)&ruleFileStream,"target to build an object file",
                 *(char **)(p_Var5 + 1),(LocalObjectInfo *)info);
      p_Var1 = p_Var5 + 1;
      p_Var6 = *(_Base_ptr *)(p_Var5 + 2);
      do {
        if (p_Var6 == p_Var5[2]._M_parent) goto LAB_0047d425;
        __lhs = &p_Var6->_M_parent;
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,"C");
        if (bVar4) break;
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,"CXX");
        if (bVar4) break;
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,"CUDA");
        if (bVar4) break;
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,"Fortran");
        p_Var6 = (_Base_ptr)&p_Var6[1]._M_parent;
      } while (!bVar4);
      if (bVar3 == false) {
        std::__cxx11::string::rfind((char *)p_Var1,0x5d86d9);
        std::__cxx11::string::substr((ulong)&base,(ulong)p_Var1);
        std::operator+(&local_358,&base,".i");
        WriteObjectConvenienceRule
                  (this,(ostream *)&ruleFileStream,"target to preprocess a source file",
                   local_358._M_dataplus._M_p,(LocalObjectInfo *)info);
        std::__cxx11::string::~string((string *)&local_358);
        *(undefined1 *)((long)&p_Var5[2]._M_right + 1) = 1;
        std::__cxx11::string::~string((string *)&base);
      }
      if (bVar2 == false) {
        std::__cxx11::string::rfind((char *)p_Var1,0x5d86d9);
        std::__cxx11::string::substr((ulong)&base,(ulong)p_Var1);
        std::operator+(&local_358,&base,".s");
        WriteObjectConvenienceRule
                  (this,(ostream *)&ruleFileStream,"target to generate assembly for a file",
                   local_358._M_dataplus._M_p,(LocalObjectInfo *)info);
        std::__cxx11::string::~string((string *)&local_358);
        *(undefined1 *)((long)&p_Var5[2]._M_right + 2) = 1;
        std::__cxx11::string::~string((string *)&base);
      }
LAB_0047d425:
    }
    std::__cxx11::string::string((string *)&base,"help",(allocator *)&local_358);
    pVar7 = std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&emittedTargets,&base);
    std::__cxx11::string::~string((string *)&base);
    if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      cmGlobalUnixMakefileGenerator3::WriteHelpRule
                ((cmGlobalUnixMakefileGenerator3 *)
                 (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator,
                 (ostream *)&ruleFileStream,this);
    }
    WriteSpecialTargetsBottom(this,(ostream *)&ruleFileStream);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
    ::~_Rb_tree(&localObjectFiles._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&emittedTargets._M_t);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&ruleFileStream);
  std::__cxx11::string::~string((string *)&ruleFileNameFull);
  std::__cxx11::string::~string((string *)&ruleFileName);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteLocalMakefile()
{
  // generate the includes
  std::string ruleFileName = "Makefile";

  // Open the rule file.  This should be copy-if-different because the
  // rules may depend on this file itself.
  std::string ruleFileNameFull = this->ConvertToFullPath(ruleFileName);
  cmGeneratedFileStream ruleFileStream(
    ruleFileNameFull.c_str(), false,
    this->GlobalGenerator->GetMakefileEncoding());
  if (!ruleFileStream) {
    return;
  }
  // always write the top makefile
  if (!this->IsRootMakefile()) {
    ruleFileStream.SetCopyIfDifferent(true);
  }

  // write the all rules
  this->WriteLocalAllRules(ruleFileStream);

  // only write local targets unless at the top Keep track of targets already
  // listed.
  std::set<std::string> emittedTargets;
  if (!this->IsRootMakefile()) {
    // write our targets, and while doing it collect up the object
    // file rules
    this->WriteLocalMakefileTargets(ruleFileStream, emittedTargets);
  } else {
    cmGlobalUnixMakefileGenerator3* gg =
      static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
    gg->WriteConvenienceRules(ruleFileStream, emittedTargets);
  }

  bool do_preprocess_rules = this->GetCreatePreprocessedSourceRules();
  bool do_assembly_rules = this->GetCreateAssemblySourceRules();

  std::map<std::string, LocalObjectInfo> localObjectFiles;
  this->GetLocalObjectFiles(localObjectFiles);

  // now write out the object rules
  // for each object file name
  for (std::map<std::string, LocalObjectInfo>::iterator lo =
         localObjectFiles.begin();
       lo != localObjectFiles.end(); ++lo) {
    // Add a convenience rule for building the object file.
    this->WriteObjectConvenienceRule(ruleFileStream,
                                     "target to build an object file",
                                     lo->first.c_str(), lo->second);

    // Check whether preprocessing and assembly rules make sense.
    // They make sense only for C and C++ sources.
    bool lang_has_preprocessor = false;
    bool lang_has_assembly = false;

    for (std::vector<LocalObjectEntry>::const_iterator ei = lo->second.begin();
         ei != lo->second.end(); ++ei) {
      if (ei->Language == "C" || ei->Language == "CXX" ||
          ei->Language == "CUDA" || ei->Language == "Fortran") {
        // Right now, C, C++, Fortran and CUDA have both a preprocessor and the
        // ability to generate assembly code
        lang_has_preprocessor = true;
        lang_has_assembly = true;
        break;
      }
    }

    // Add convenience rules for preprocessed and assembly files.
    if (lang_has_preprocessor && do_preprocess_rules) {
      std::string::size_type dot_pos = lo->first.rfind(".");
      std::string base = lo->first.substr(0, dot_pos);
      this->WriteObjectConvenienceRule(ruleFileStream,
                                       "target to preprocess a source file",
                                       (base + ".i").c_str(), lo->second);
      lo->second.HasPreprocessRule = true;
    }

    if (lang_has_assembly && do_assembly_rules) {
      std::string::size_type dot_pos = lo->first.rfind(".");
      std::string base = lo->first.substr(0, dot_pos);
      this->WriteObjectConvenienceRule(
        ruleFileStream, "target to generate assembly for a file",
        (base + ".s").c_str(), lo->second);
      lo->second.HasAssembleRule = true;
    }
  }

  // add a help target as long as there isn;t a real target named help
  if (emittedTargets.insert("help").second) {
    cmGlobalUnixMakefileGenerator3* gg =
      static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
    gg->WriteHelpRule(ruleFileStream, this);
  }

  this->WriteSpecialTargetsBottom(ruleFileStream);
}